

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengineex.cpp
# Opt level: O3

QDebug * operator<<(QDebug *s,QVectorPath *path)

{
  Stream *pSVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QDebugStateSaver saver;
  QRectF local_70;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48;
  QDebug local_40 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_48,(QDebug *)s);
  local_70.h._0_4_ = 0xffffffff;
  local_70.h._4_4_ = 0xffffffff;
  uStack_50 = 0xffffffff;
  uStack_4c = 0xffffffff;
  local_70.yp._0_4_ = 0xffffffff;
  local_70.yp._4_4_ = 0xffffffff;
  local_70.w._0_4_ = 0xffffffff;
  local_70.w._4_4_ = 0xffffffff;
  QVectorPath::controlPointRect(path);
  pSVar1 = s->stream;
  QVar2.m_data = (storage_type *)0x11;
  QVar2.m_size = (qsizetype)local_40;
  QString::fromUtf8(QVar2);
  QTextStream::operator<<(&pSVar1->ts,(QString *)local_40);
  if (local_40[0].stream != (Stream *)0x0) {
    LOCK();
    *(int *)local_40[0].stream = *(int *)local_40[0].stream + -1;
    UNLOCK();
    if (*(int *)local_40[0].stream == 0) {
      QArrayData::deallocate((QArrayData *)local_40[0].stream,2,0x10);
    }
  }
  pSVar1 = s->stream;
  if (pSVar1->space == true) {
    QTextStream::operator<<(&pSVar1->ts,' ');
    pSVar1 = s->stream;
  }
  QTextStream::operator<<(&pSVar1->ts,path->m_count);
  pSVar1 = s->stream;
  if (pSVar1->space == true) {
    QTextStream::operator<<(&pSVar1->ts,' ');
    pSVar1 = s->stream;
  }
  QVar3.m_data = (storage_type *)0x7;
  QVar3.m_size = (qsizetype)local_40;
  QString::fromUtf8(QVar3);
  QTextStream::operator<<(&pSVar1->ts,(QString *)local_40);
  if (local_40[0].stream != (Stream *)0x0) {
    LOCK();
    *(int *)local_40[0].stream = *(int *)local_40[0].stream + -1;
    UNLOCK();
    if (*(int *)local_40[0].stream == 0) {
      QArrayData::deallocate((QArrayData *)local_40[0].stream,2,0x10);
    }
  }
  pSVar1 = s->stream;
  if (pSVar1->space == true) {
    QTextStream::operator<<(&pSVar1->ts,' ');
    pSVar1 = s->stream;
  }
  Qt::hex(&pSVar1->ts);
  QTextStream::operator<<(&s->stream->ts,path->m_hints);
  local_70.xp = (qreal)s->stream;
  if (((Stream *)local_70.xp)->space == true) {
    QTextStream::operator<<((QTextStream *)local_70.xp,' ');
    local_70.xp = (qreal)s->stream;
  }
  ((Stream *)local_70.xp)->ref = ((Stream *)local_70.xp)->ref + 1;
  operator<<((QDebug *)local_40,&local_70);
  QTextStream::operator<<(&(local_40[0].stream)->ts,')');
  if ((local_40[0].stream)->space == true) {
    QTextStream::operator<<(&(local_40[0].stream)->ts,' ');
  }
  QDebug::~QDebug(local_40);
  QDebug::~QDebug((QDebug *)&local_70);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDebug Q_GUI_EXPORT &operator<<(QDebug &s, const QVectorPath &path)
{
    QDebugStateSaver saver(s);
    QRectF rf = path.controlPointRect();
    s << "QVectorPath(size:" << path.elementCount()
      << " hints:" << Qt::hex << path.hints()
      << rf << ')';
    return s;
}